

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::inc_e(CPU *this)

{
  uint8_t *puVar1;
  Registers *pRVar2;
  uint8_t uVar3;
  byte bVar4;
  
  pRVar2 = this->regs;
  bVar4 = pRVar2->f & 0x10;
  pRVar2->f = bVar4;
  if ((~pRVar2->e & 0xf) == 0) {
    pRVar2->f = bVar4 | 0x20;
  }
  uVar3 = pRVar2->e + 1;
  pRVar2->e = uVar3;
  if (uVar3 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::inc_e() {
    inc_r8(regs.e);
    return 1;
}